

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

void pospopcnt_u8_sse_horizreduce(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint8_t *puVar11;
  uint64_t uVar12;
  ulong uVar13;
  uint32_t *in_RDX;
  ulong in_RSI;
  ulong uVar15;
  uint8_t *in_RDI;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i x;
  __m128i x_00;
  __m128i x_01;
  __m128i x_02;
  __m128i x_03;
  __m128i x_04;
  __m128i x_05;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i alVar24;
  __m128i sum7;
  __m128i sum6;
  __m128i sum5;
  __m128i sum4;
  __m128i sum3;
  __m128i sum2;
  __m128i sum1;
  __m128i sum0;
  __m128i mask_hi;
  __m128i mask_lo;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  __m128i r3;
  __m128i r2;
  __m128i r1;
  __m128i r0;
  uint8_t *end;
  __m128i counter_h;
  __m128i counter_g;
  __m128i counter_f;
  __m128i counter_e;
  __m128i counter_d;
  __m128i counter_c;
  __m128i counter_b;
  __m128i counter_a;
  __m128i zero;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  uint8_t *local_290;
  uint32_t *puVar14;
  
  local_2c8 = ZEXT816(0);
  local_2d8 = ZEXT816(0);
  local_2e8 = ZEXT816(0);
  local_2f8 = ZEXT816(0);
  local_308 = ZEXT816(0);
  local_318 = ZEXT816(0);
  local_328 = ZEXT816(0);
  local_338 = ZEXT816(0);
  uVar13 = in_RSI & 0xffffffffffffffc0;
  puVar11 = in_RDI + uVar13;
  puVar14 = in_RDX;
  uVar15 = in_RSI;
  for (local_290 = in_RDI; local_290 != puVar11; local_290 = local_290 + 0x40) {
    uVar17 = *(undefined8 *)local_290;
    uVar21 = *(undefined8 *)(local_290 + 8);
    a[1] = uVar15;
    a[0] = (longlong)in_RDI;
    b[1] = uVar13;
    b[0] = (longlong)puVar14;
    uVar16 = uVar17;
    uVar20 = uVar21;
    alVar24 = sse4_add1_even(a,b);
    b_00[0] = alVar24[1];
    a_00[1] = uVar15;
    a_00[0] = (longlong)in_RDI;
    b_00[1] = uVar13;
    alVar24 = sse4_add1_odd(a_00,b_00);
    b_01[0] = alVar24[1];
    a_01[1] = uVar15;
    a_01[0] = (longlong)in_RDI;
    b_01[1] = uVar13;
    alVar24 = sse4_add1_even(a_01,b_01);
    b_02[0] = alVar24[1];
    a_02[1] = uVar15;
    a_02[0] = (longlong)in_RDI;
    b_02[1] = uVar13;
    alVar24 = sse4_add1_odd(a_02,b_02);
    b_03[0] = alVar24[1];
    a_03[1] = uVar15;
    a_03[0] = (longlong)in_RDI;
    b_03[1] = uVar13;
    uVar18 = uVar16;
    uVar22 = uVar20;
    alVar24 = sse4_add2_even(a_03,b_03);
    b_04[0] = alVar24[1];
    a_04[1] = uVar15;
    a_04[0] = (longlong)in_RDI;
    b_04[1] = uVar13;
    uVar19 = uVar17;
    uVar23 = uVar21;
    alVar24 = sse4_add2_even(a_04,b_04);
    b_05[0] = alVar24[1];
    a_05[1] = uVar15;
    a_05[0] = (longlong)in_RDI;
    b_05[1] = uVar13;
    alVar24 = sse4_add2_odd(a_05,b_05);
    b_06[0] = alVar24[1];
    a_06[1] = uVar15;
    a_06[0] = (longlong)in_RDI;
    b_06[1] = uVar13;
    alVar24 = sse4_add2_odd(a_06,b_06);
    puVar14 = alVar24[1];
    auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar1 = vpinsrb_avx(auVar1,0xf,2);
    auVar1 = vpinsrb_avx(auVar1,0xf,3);
    auVar1 = vpinsrb_avx(auVar1,0xf,4);
    auVar1 = vpinsrb_avx(auVar1,0xf,5);
    auVar1 = vpinsrb_avx(auVar1,0xf,6);
    auVar1 = vpinsrb_avx(auVar1,0xf,7);
    auVar1 = vpinsrb_avx(auVar1,0xf,8);
    auVar1 = vpinsrb_avx(auVar1,0xf,9);
    auVar1 = vpinsrb_avx(auVar1,0xf,10);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
    auVar2 = vpinsrb_avx(auVar1,0xf,0xf);
    auVar1 = vpinsrb_avx(ZEXT116(0xf0),0xf0,1);
    auVar1 = vpinsrb_avx(auVar1,0xf0,2);
    auVar1 = vpinsrb_avx(auVar1,0xf0,3);
    auVar1 = vpinsrb_avx(auVar1,0xf0,4);
    auVar1 = vpinsrb_avx(auVar1,0xf0,5);
    auVar1 = vpinsrb_avx(auVar1,0xf0,6);
    auVar1 = vpinsrb_avx(auVar1,0xf0,7);
    auVar1 = vpinsrb_avx(auVar1,0xf0,8);
    auVar1 = vpinsrb_avx(auVar1,0xf0,9);
    auVar1 = vpinsrb_avx(auVar1,0xf0,10);
    auVar1 = vpinsrb_avx(auVar1,0xf0,0xb);
    auVar1 = vpinsrb_avx(auVar1,0xf0,0xc);
    auVar1 = vpinsrb_avx(auVar1,0xf0,0xd);
    auVar1 = vpinsrb_avx(auVar1,0xf0,0xe);
    auVar3 = vpinsrb_avx(auVar1,0xf0,0xf);
    auVar4._8_8_ = uVar22;
    auVar4._0_8_ = uVar18;
    auVar1 = vpand_avx(auVar4,auVar2);
    auVar4 = vpsadbw_avx(auVar1,ZEXT816(0));
    auVar5._8_8_ = uVar22;
    auVar5._0_8_ = uVar18;
    auVar1 = vpand_avx(auVar5,auVar3);
    auVar5 = vpsadbw_avx(auVar1,ZEXT816(0));
    auVar6._8_8_ = uVar23;
    auVar6._0_8_ = uVar19;
    auVar1 = vpand_avx(auVar6,auVar2);
    auVar6 = vpsadbw_avx(auVar1,ZEXT816(0));
    auVar7._8_8_ = uVar23;
    auVar7._0_8_ = uVar19;
    auVar1 = vpand_avx(auVar7,auVar3);
    auVar7 = vpsadbw_avx(auVar1,ZEXT816(0));
    auVar8._8_8_ = uVar20;
    auVar8._0_8_ = uVar16;
    auVar1 = vpand_avx(auVar8,auVar2);
    auVar8 = vpsadbw_avx(auVar1,ZEXT816(0));
    auVar9._8_8_ = uVar20;
    auVar9._0_8_ = uVar16;
    auVar1 = vpand_avx(auVar9,auVar3);
    auVar9 = vpsadbw_avx(auVar1,ZEXT816(0));
    auVar1._8_8_ = uVar21;
    auVar1._0_8_ = uVar17;
    auVar1 = vpand_avx(auVar1,auVar2);
    auVar2 = vpsadbw_avx(auVar1,ZEXT816(0));
    auVar10._8_8_ = uVar21;
    auVar10._0_8_ = uVar17;
    auVar1 = vpand_avx(auVar10,auVar3);
    auVar1 = vpsadbw_avx(auVar1,ZEXT816(0));
    local_2c8 = vpaddq_avx(local_2c8,auVar4);
    local_2d8 = vpaddq_avx(local_2d8,auVar5);
    local_2e8 = vpaddq_avx(local_2e8,auVar6);
    local_2f8 = vpaddq_avx(local_2f8,auVar7);
    local_308 = vpaddq_avx(local_308,auVar8);
    local_318 = vpaddq_avx(local_318,auVar9);
    local_328 = vpaddq_avx(local_328,auVar2);
    local_338 = vpaddq_avx(local_338,auVar1);
  }
  alVar24[1] = uVar15;
  alVar24[0] = (longlong)in_RDI;
  uVar12 = sse4_sum_epu64(alVar24);
  *in_RDX = *in_RDX + (int)uVar12;
  x[1] = uVar15;
  x[0] = (longlong)in_RDI;
  uVar12 = sse4_sum_epu64(x);
  in_RDX[1] = in_RDX[1] + (int)uVar12;
  x_00[1] = uVar15;
  x_00[0] = (longlong)in_RDI;
  uVar12 = sse4_sum_epu64(x_00);
  in_RDX[2] = in_RDX[2] + (int)uVar12;
  x_01[1] = uVar15;
  x_01[0] = (longlong)in_RDI;
  uVar12 = sse4_sum_epu64(x_01);
  in_RDX[3] = in_RDX[3] + (int)uVar12;
  x_02[1] = uVar15;
  x_02[0] = (longlong)in_RDI;
  uVar12 = sse4_sum_epu64(x_02);
  in_RDX[4] = in_RDX[4] + (int)(uVar12 >> 4);
  x_03[1] = uVar15;
  x_03[0] = (longlong)in_RDI;
  uVar12 = sse4_sum_epu64(x_03);
  in_RDX[5] = in_RDX[5] + (int)(uVar12 >> 4);
  x_04[1] = uVar15;
  x_04[0] = (longlong)in_RDI;
  uVar12 = sse4_sum_epu64(x_04);
  in_RDX[6] = in_RDX[6] + (int)(uVar12 >> 4);
  x_05[1] = uVar15;
  x_05[0] = (longlong)in_RDI;
  uVar12 = sse4_sum_epu64(x_05);
  in_RDX[7] = in_RDX[7] + (int)(uVar12 >> 4);
  pospopcnt_u8_scalar_naive(local_290,in_RSI & 0x3f,in_RDX);
  return;
}

Assistant:

void pospopcnt_u8_sse_horizreduce(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m128i zero = _mm_setzero_si128();

    __m128i counter_a = zero;
    __m128i counter_b = zero;
    __m128i counter_c = zero;
    __m128i counter_d = zero;
    __m128i counter_e = zero;
    __m128i counter_f = zero;
    __m128i counter_g = zero;
    __m128i counter_h = zero;

    for (const uint8_t* end = &data[(len & ~63)]; data != end; data += 64) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m128i r0 = _mm_loadu_si128((__m128i*)&data[0*16]);
        const __m128i r1 = _mm_loadu_si128((__m128i*)&data[1*16]);
        const __m128i r2 = _mm_loadu_si128((__m128i*)&data[2*16]);
        const __m128i r3 = _mm_loadu_si128((__m128i*)&data[3*16]);

        // s0 = [a0+a1|c0+c1|e0+e1|g0+g1]
        // s1 = [b0+b1|d0+d1|f0+f1|h0+h1]
        // s2 = [a2+a3|c2+c3|e2+e3|g2+g3]
        // s3 = [b2+b3|d2+d3|f2+f3|h2+h3]
        const __m128i s0 = sse4_add1_even(r0, r1);
        const __m128i s1 = sse4_add1_odd (r0, r1);
        const __m128i s2 = sse4_add1_even(r2, r3);
        const __m128i s3 = sse4_add1_odd (r2, r3);

        // d0 = [a0+a1+a2+a3|e0+e1+e2+e3]
        // d1 = [b0+b1+b2+b3|f0+f1+f2+f3]
        // d2 = [c0+c1+c2+c3|g0+g1+g2+g3]
        // d3 = [d0+d1+d2+d3|h0+h1+h2+h3]
        const __m128i d0 = sse4_add2_even(s0, s2);
        const __m128i d1 = sse4_add2_even(s1, s3);
        const __m128i d2 = sse4_add2_odd (s0, s2);
        const __m128i d3 = sse4_add2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m128i mask_lo = _mm_set1_epi8(0x0f);
        const __m128i mask_hi = _mm_set1_epi8(0xf0);
        // Note: counter for higher nibble have to be divided by 16
        const __m128i sum0 = _mm_sad_epu8(d0 & mask_lo, zero);
        const __m128i sum1 = _mm_sad_epu8(d0 & mask_hi, zero);
        const __m128i sum2 = _mm_sad_epu8(d1 & mask_lo, zero);
        const __m128i sum3 = _mm_sad_epu8(d1 & mask_hi, zero);
        const __m128i sum4 = _mm_sad_epu8(d2 & mask_lo, zero);
        const __m128i sum5 = _mm_sad_epu8(d2 & mask_hi, zero);
        const __m128i sum6 = _mm_sad_epu8(d3 & mask_lo, zero);
        const __m128i sum7 = _mm_sad_epu8(d3 & mask_hi, zero);

        counter_a = _mm_add_epi64(counter_a, sum0);
        counter_b = _mm_add_epi64(counter_b, sum1);
        counter_c = _mm_add_epi64(counter_c, sum2);
        counter_d = _mm_add_epi64(counter_d, sum3);
        counter_e = _mm_add_epi64(counter_e, sum4);
        counter_f = _mm_add_epi64(counter_f, sum5);
        counter_g = _mm_add_epi64(counter_g, sum6);
        counter_h = _mm_add_epi64(counter_h, sum7);
    }

    flag_counts[0] += sse4_sum_epu64(counter_a);
    flag_counts[1] += sse4_sum_epu64(counter_c);
    flag_counts[2] += sse4_sum_epu64(counter_e);
    flag_counts[3] += sse4_sum_epu64(counter_g);
    flag_counts[4] += sse4_sum_epu64(counter_b) >> 4;
    flag_counts[5] += sse4_sum_epu64(counter_d) >> 4;
    flag_counts[6] += sse4_sum_epu64(counter_f) >> 4;
    flag_counts[7] += sse4_sum_epu64(counter_h) >> 4;

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % 64, flag_counts);
}